

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O2

void Prs_ManWriteVerilogSignal(FILE *pFile,Prs_Ntk_t *p,int Sig)

{
  int iVar1;
  int NameId;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = Abc_Lit2Var2(Sig);
  if (-1 < Sig) {
    switch(Sig & 3) {
    case 0:
      pcVar2 = Prs_ObjGetName(p,iVar1);
      break;
    case 1:
      NameId = Vec_IntEntry(&p->vSlices,iVar1);
      pcVar2 = Prs_ObjGetName(p,NameId);
      iVar1 = Vec_IntEntry(&p->vSlices,iVar1 + 1);
      pcVar3 = Prs_ManWriteRange(p,iVar1,1);
      fprintf((FILE *)pFile,"%s%s",pcVar2,pcVar3);
      return;
    case 2:
      pcVar2 = Abc_NamStr(p->pFuns,iVar1);
      break;
    case 3:
      Prs_CatSignals_V._0_4_ = Vec_IntEntry(&p->vConcats,iVar1);
      Prs_CatSignals_V._4_4_ = Prs_CatSignals_V._0_4_;
      Prs_CatSignals_V._8_8_ = Vec_IntEntryP(&p->vConcats,iVar1 + 1);
      fputc(0x7b,(FILE *)pFile);
      Prs_ManWriteVerilogArray(pFile,p,(Vec_Int_t *)Prs_CatSignals_V,0);
      fputc(0x7d,(FILE *)pFile);
      return;
    }
    fputs(pcVar2,(FILE *)pFile);
    return;
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x13e,"int Abc_Lit2Att2(int)");
}

Assistant:

static void Prs_ManWriteVerilogSignal( FILE * pFile, Prs_Ntk_t * p, int Sig )
{
    int Value = Abc_Lit2Var2( Sig );
    Prs_ManType_t Type = (Prs_ManType_t)Abc_Lit2Att2( Sig );
    if ( Type == CBA_PRS_NAME )
        fprintf( pFile, "%s", Prs_ObjGetName(p, Value) );
    else if ( Type == CBA_PRS_CONST )
        fprintf( pFile, "%s", Prs_NtkConst(p, Value) );
    else if ( Type == CBA_PRS_SLICE )
        fprintf( pFile, "%s%s", Prs_ObjGetName(p, Prs_SliceName(p, Value)), Prs_ManWriteRange(p, Prs_SliceRange(p, Value), 1) );
    else if ( Type == CBA_PRS_CONCAT )
        Prs_ManWriteVerilogConcat( pFile, p, Value );
    else assert( 0 );
}